

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSubSimplexConvexCast.cpp
# Opt level: O2

bool __thiscall
btSubsimplexConvexCast::calcTimeOfImpact
          (btSubsimplexConvexCast *this,btTransform *fromA,btTransform *toA,btTransform *fromB,
          btTransform *toB,CastResult *result)

{
  btConvexShape *pbVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  undefined1 auVar4 [16];
  CastResult *pCVar5;
  bool bVar6;
  int iVar7;
  btScalar extraout_XMM0_Da;
  btScalar extraout_XMM0_Da_00;
  btScalar bVar8;
  btScalar extraout_XMM0_Db;
  btScalar extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  btScalar bVar9;
  undefined4 uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  btVector3 bVar14;
  btVector3 bVar15;
  undefined1 local_198 [16];
  btVector3 local_188;
  btVector3 r;
  btVector3 local_168;
  undefined1 local_158 [16];
  btVector3 local_148;
  btVector3 local_130;
  CastResult *local_120;
  btVector3 *local_118;
  btVector3 *local_110;
  btVector3 *local_108;
  btVector3 *local_100;
  btVector3 hitB;
  btVector3 hitA;
  btVector3 local_d8;
  btVector3 local_c8;
  btTransform interpolatedTransB;
  btTransform interpolatedTransA;
  
  local_120 = result;
  btVoronoiSimplexSolver::reset(this->m_simplexSolver);
  local_108 = &toA->m_origin;
  local_110 = &fromA->m_origin;
  bVar14 = operator-(local_108,local_110);
  local_158._8_4_ = extraout_XMM0_Dc;
  local_158._0_8_ = bVar14.m_floats._0_8_;
  local_158._12_4_ = extraout_XMM0_Dd;
  local_100 = &toB->m_origin;
  local_118 = &fromB->m_origin;
  bVar15 = operator-(local_100,local_118);
  interpolatedTransA.m_basis.m_el[0].m_floats._0_8_ =
       *(undefined8 *)(fromA->m_basis).m_el[0].m_floats;
  interpolatedTransA.m_basis.m_el[0].m_floats._8_8_ =
       *(undefined8 *)((fromA->m_basis).m_el[0].m_floats + 2);
  interpolatedTransA.m_basis.m_el[1].m_floats._0_8_ =
       *(undefined8 *)(fromA->m_basis).m_el[1].m_floats;
  interpolatedTransA.m_basis.m_el[1].m_floats._8_8_ =
       *(undefined8 *)((fromA->m_basis).m_el[1].m_floats + 2);
  interpolatedTransA.m_basis.m_el[2].m_floats._0_8_ =
       *(undefined8 *)(fromA->m_basis).m_el[2].m_floats;
  interpolatedTransA.m_basis.m_el[2].m_floats._8_8_ =
       *(undefined8 *)((fromA->m_basis).m_el[2].m_floats + 2);
  interpolatedTransA.m_origin.m_floats._0_8_ = *(undefined8 *)(fromA->m_origin).m_floats;
  interpolatedTransA.m_origin.m_floats._8_8_ = *(undefined8 *)((fromA->m_origin).m_floats + 2);
  interpolatedTransB.m_basis.m_el[0].m_floats._0_8_ =
       *(undefined8 *)(fromB->m_basis).m_el[0].m_floats;
  interpolatedTransB.m_basis.m_el[0].m_floats._8_8_ =
       *(undefined8 *)((fromB->m_basis).m_el[0].m_floats + 2);
  interpolatedTransB.m_basis.m_el[1].m_floats._0_8_ =
       *(undefined8 *)(fromB->m_basis).m_el[1].m_floats;
  interpolatedTransB.m_basis.m_el[1].m_floats._8_8_ =
       *(undefined8 *)((fromB->m_basis).m_el[1].m_floats + 2);
  interpolatedTransB.m_basis.m_el[2].m_floats._0_8_ =
       *(undefined8 *)(fromB->m_basis).m_el[2].m_floats;
  interpolatedTransB.m_basis.m_el[2].m_floats._8_8_ =
       *(undefined8 *)((fromB->m_basis).m_el[2].m_floats + 2);
  interpolatedTransB.m_origin.m_floats._0_8_ = *(undefined8 *)(fromB->m_origin).m_floats;
  interpolatedTransB.m_origin.m_floats._8_8_ = *(undefined8 *)((fromB->m_origin).m_floats + 2);
  fVar11 = (float)local_158._0_4_ - bVar15.m_floats[0];
  fVar12 = (float)local_158._4_4_ - bVar15.m_floats[1];
  local_198._0_4_ = bVar14.m_floats[2];
  fVar13 = (float)local_198._0_4_ - bVar15.m_floats[2];
  uVar10 = 0;
  r.m_floats[1] = fVar12;
  r.m_floats[0] = fVar11;
  r.m_floats[2] = fVar13;
  r.m_floats[3] = 0.0;
  pbVar1 = this->m_convexA;
  uVar3 = CONCAT44(fVar12,fVar11) ^ 0x8000000080000000;
  local_148.m_floats[2] = -fVar13;
  local_148.m_floats[0] = (btScalar)(int)uVar3;
  local_148.m_floats[1] = (btScalar)(int)(uVar3 >> 0x20);
  local_148.m_floats[3] = 0.0;
  local_130 = operator*(&local_148,&fromA->m_basis);
  bVar8 = local_130.m_floats[2];
  bVar9 = local_130.m_floats[3];
  (*(pbVar1->super_btCollisionShape)._vptr_btCollisionShape[0x10])(pbVar1,&local_130);
  local_188.m_floats[1] = extraout_XMM0_Db;
  local_188.m_floats[0] = extraout_XMM0_Da;
  local_188.m_floats[2] = bVar8;
  local_188.m_floats[3] = bVar9;
  bVar14 = btTransform::operator()(fromA,&local_188);
  local_158._8_4_ = extraout_XMM0_Dc_00;
  local_158._0_8_ = bVar14.m_floats._0_8_;
  local_158._12_4_ = extraout_XMM0_Dd_00;
  auVar2._8_4_ = fVar13;
  auVar2._0_8_ = bVar14.m_floats._8_8_;
  auVar2._12_4_ = uVar10;
  pbVar1 = this->m_convexB;
  local_168 = bVar14;
  local_148 = operator*(&r,&fromB->m_basis);
  bVar8 = local_148.m_floats[2];
  bVar9 = local_148.m_floats[3];
  (*(pbVar1->super_btCollisionShape)._vptr_btCollisionShape[0x10])(pbVar1,&local_148);
  local_188.m_floats[1] = extraout_XMM0_Db_00;
  local_188.m_floats[0] = extraout_XMM0_Da_00;
  local_188.m_floats[2] = bVar8;
  local_188.m_floats[3] = bVar9;
  local_130 = btTransform::operator()(fromB,&local_188);
  local_198._0_4_ = bVar14.m_floats[2];
  local_188.m_floats[1] = (float)local_158._4_4_ - local_130.m_floats[1];
  local_188.m_floats[0] = (float)local_158._0_4_ - local_130.m_floats[0];
  local_188.m_floats[2] = (float)local_198._0_4_ - local_130.m_floats[2];
  local_188.m_floats[3] = 0.0;
  local_148.m_floats = (btScalar  [4])ZEXT816(0);
  fVar13 = btVector3::length2(&local_188);
  local_198._4_12_ = auVar2._4_12_;
  auVar4._12_4_ = 0;
  auVar4._0_12_ = local_198._4_12_;
  local_198 = auVar4 << 0x20;
  iVar7 = -0x20;
  while ((pCVar5 = local_120, 0.0001 < fVar13 && (iVar7 != 0))) {
    local_158._0_4_ = iVar7;
    pbVar1 = this->m_convexA;
    local_c8.m_floats[2] = -local_188.m_floats[2];
    local_c8.m_floats[0] = (btScalar)(int)(local_188.m_floats._0_8_ ^ 0x8000000080000000);
    local_c8.m_floats[1] = (btScalar)(int)((local_188.m_floats._0_8_ ^ 0x8000000080000000) >> 0x20);
    local_c8.m_floats[3] = 0.0;
    hitB = operator*(&local_c8,&interpolatedTransA.m_basis);
    bVar8 = hitB.m_floats[2];
    bVar9 = hitB.m_floats[3];
    (*(pbVar1->super_btCollisionShape)._vptr_btCollisionShape[0x10])(pbVar1,&hitB);
    hitA.m_floats[2] = bVar8;
    hitA.m_floats[3] = bVar9;
    local_168 = btTransform::operator()(&interpolatedTransA,&hitA);
    pbVar1 = this->m_convexB;
    hitB = operator*(&local_188,&interpolatedTransB.m_basis);
    bVar8 = hitB.m_floats[2];
    bVar9 = hitB.m_floats[3];
    (*(pbVar1->super_btCollisionShape)._vptr_btCollisionShape[0x10])(pbVar1,&hitB);
    hitA.m_floats[2] = bVar8;
    hitA.m_floats[3] = bVar9;
    local_130 = btTransform::operator()(&interpolatedTransB,&hitA);
    fVar13 = local_168.m_floats[0] - local_130.m_floats[0];
    fVar11 = local_168.m_floats[1] - local_130.m_floats[1];
    fVar12 = local_168.m_floats[2] - local_130.m_floats[2];
    local_d8.m_floats[1] = fVar11;
    local_d8.m_floats[0] = fVar13;
    local_d8.m_floats[2] = fVar12;
    local_d8.m_floats[3] = 0.0;
    if (1.0 < (float)local_198._0_4_) goto LAB_001673c0;
    fVar13 = fVar12 * local_188.m_floats[2] +
             fVar11 * local_188.m_floats[1] + local_188.m_floats[0] * fVar13;
    if (0.0 < fVar13) {
      fVar11 = local_188.m_floats[2] * r.m_floats[2] +
               local_188.m_floats[0] * r.m_floats[0] + local_188.m_floats[1] * r.m_floats[1];
      if (-1.4210855e-14 <= fVar11) goto LAB_001673c0;
      fVar13 = (float)local_198._0_4_ - fVar13 / fVar11;
      local_198._0_4_ = fVar13;
      btVector3::setInterpolate3(&interpolatedTransA.m_origin,local_110,local_108,fVar13);
      btVector3::setInterpolate3(&interpolatedTransB.m_origin,local_118,local_100,fVar13);
      local_d8.m_floats[1] = local_168.m_floats[1] - local_130.m_floats[1];
      local_d8.m_floats[0] = local_168.m_floats[0] - local_130.m_floats[0];
      local_d8.m_floats[2] = local_168.m_floats[2] - local_130.m_floats[2];
      local_d8.m_floats[3] = 0.0;
      local_148.m_floats[0] = local_188.m_floats[0];
      local_148.m_floats[1] = local_188.m_floats[1];
      local_148.m_floats[2] = local_188.m_floats[2];
      local_148.m_floats[3] = local_188.m_floats[3];
    }
    bVar6 = btVoronoiSimplexSolver::inSimplex(this->m_simplexSolver,&local_d8);
    if (!bVar6) {
      btVoronoiSimplexSolver::addVertex(this->m_simplexSolver,&local_d8,&local_168,&local_130);
    }
    bVar6 = btVoronoiSimplexSolver::closest(this->m_simplexSolver,&local_188);
    fVar13 = 0.0;
    if (bVar6) {
      fVar13 = btVector3::length2(&local_188);
    }
    iVar7 = local_158._0_4_ + 1;
  }
  local_120->m_fraction = (btScalar)local_198._0_4_;
  bVar8 = btVector3::length2(&local_148);
  if (1.4210855e-14 <= bVar8) {
    bVar14 = btVector3::normalized(&local_148);
    fVar12 = bVar14.m_floats[2];
    fVar13 = bVar14.m_floats[0];
    fVar11 = bVar14.m_floats[1];
    *&(pCVar5->m_normal).m_floats = bVar14.m_floats;
  }
  else {
    (pCVar5->m_normal).m_floats[0] = 0.0;
    (pCVar5->m_normal).m_floats[1] = 0.0;
    (pCVar5->m_normal).m_floats[2] = 0.0;
    (pCVar5->m_normal).m_floats[3] = 0.0;
    fVar12 = 0.0;
    fVar11 = 0.0;
    fVar13 = 0.0;
  }
  if (-pCVar5->m_allowedPenetration <=
      fVar12 * r.m_floats[2] + fVar13 * r.m_floats[0] + fVar11 * r.m_floats[1]) {
LAB_001673c0:
    bVar6 = false;
  }
  else {
    btVoronoiSimplexSolver::compute_points(this->m_simplexSolver,&hitA,&hitB);
    *(undefined8 *)(pCVar5->m_hitPoint).m_floats = hitB.m_floats._0_8_;
    *(undefined8 *)((pCVar5->m_hitPoint).m_floats + 2) = hitB.m_floats._8_8_;
    bVar6 = true;
  }
  return bVar6;
}

Assistant:

bool	btSubsimplexConvexCast::calcTimeOfImpact(
		const btTransform& fromA,
		const btTransform& toA,
		const btTransform& fromB,
		const btTransform& toB,
		CastResult& result)
{

	m_simplexSolver->reset();

	btVector3 linVelA,linVelB;
	linVelA = toA.getOrigin()-fromA.getOrigin();
	linVelB = toB.getOrigin()-fromB.getOrigin();

	btScalar lambda = btScalar(0.);

	btTransform interpolatedTransA = fromA;
	btTransform interpolatedTransB = fromB;

	///take relative motion
	btVector3 r = (linVelA-linVelB);
	btVector3 v;
	
	btVector3 supVertexA = fromA(m_convexA->localGetSupportingVertex(-r*fromA.getBasis()));
	btVector3 supVertexB = fromB(m_convexB->localGetSupportingVertex(r*fromB.getBasis()));
	v = supVertexA-supVertexB;
	int maxIter = MAX_ITERATIONS;

	btVector3 n;
	n.setValue(btScalar(0.),btScalar(0.),btScalar(0.));
	
	btVector3 c;

	


	btScalar dist2 = v.length2();
#ifdef BT_USE_DOUBLE_PRECISION
	btScalar epsilon = btScalar(0.0001);
#else
	btScalar epsilon = btScalar(0.0001);
#endif //BT_USE_DOUBLE_PRECISION
	btVector3	w,p;
	btScalar VdotR;
	
	while ( (dist2 > epsilon) && maxIter--)
	{
		supVertexA = interpolatedTransA(m_convexA->localGetSupportingVertex(-v*interpolatedTransA.getBasis()));
		supVertexB = interpolatedTransB(m_convexB->localGetSupportingVertex(v*interpolatedTransB.getBasis()));
		w = supVertexA-supVertexB;

		btScalar VdotW = v.dot(w);

		if (lambda > btScalar(1.0))
		{
			return false;
		}

		if ( VdotW > btScalar(0.))
		{
			VdotR = v.dot(r);

			if (VdotR >= -(SIMD_EPSILON*SIMD_EPSILON))
				return false;
			else
			{
				lambda = lambda - VdotW / VdotR;
				//interpolate to next lambda
				//	x = s + lambda * r;
				interpolatedTransA.getOrigin().setInterpolate3(fromA.getOrigin(),toA.getOrigin(),lambda);
				interpolatedTransB.getOrigin().setInterpolate3(fromB.getOrigin(),toB.getOrigin(),lambda);
				//m_simplexSolver->reset();
				//check next line
				 w = supVertexA-supVertexB;
				
				n = v;
				
			}
		} 
		///Just like regular GJK only add the vertex if it isn't already (close) to current vertex, it would lead to divisions by zero and NaN etc.
		if (!m_simplexSolver->inSimplex(w))
			m_simplexSolver->addVertex( w, supVertexA , supVertexB);

		if (m_simplexSolver->closest(v))
		{
			dist2 = v.length2();
			
			//todo: check this normal for validity
			//n=v;
			//printf("V=%f , %f, %f\n",v[0],v[1],v[2]);
			//printf("DIST2=%f\n",dist2);
			//printf("numverts = %i\n",m_simplexSolver->numVertices());
		} else
		{
			dist2 = btScalar(0.);
		} 
	}

	//int numiter = MAX_ITERATIONS - maxIter;
//	printf("number of iterations: %d", numiter);
	
	//don't report a time of impact when moving 'away' from the hitnormal
	

	result.m_fraction = lambda;
	if (n.length2() >= (SIMD_EPSILON*SIMD_EPSILON))
		result.m_normal = n.normalized();
	else
		result.m_normal = btVector3(btScalar(0.0), btScalar(0.0), btScalar(0.0));

	//don't report time of impact for motion away from the contact normal (or causes minor penetration)
	if (result.m_normal.dot(r)>=-result.m_allowedPenetration)
		return false;

	btVector3 hitA,hitB;
	m_simplexSolver->compute_points(hitA,hitB);
	result.m_hitPoint=hitB;
	return true;
}